

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::update_i2p_bridge(session_impl *this)

{
  mutex *pmVar1;
  int iVar2;
  string *psVar3;
  error_code ec;
  i2p_session_options session_options;
  undefined1 local_68 [16];
  i2p_session_options local_58;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_48;
  
  psVar3 = session_settings::get_str_abi_cxx11_(&this->m_settings,9);
  if (psVar3->_M_string_length == 0) {
    local_68._0_8_ = (ulong)(uint3)local_68._5_3_ << 0x28;
    local_68._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
    i2p_connection::close(&this->m_i2p_conn,(int)local_68);
  }
  else {
    pmVar1 = &(this->m_settings).m_mutex;
    local_68._8_8_ = local_68._8_8_ & 0xffffffffffffff00;
    local_68._0_8_ = pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = true;
    iVar2 = (this->m_settings).m_store.m_ints._M_elems[0x99];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = false;
    local_68._0_8_ = pmVar1;
    local_58.m_inbound_quantity = iVar2;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = true;
    iVar2 = (this->m_settings).m_store.m_ints._M_elems[0x9a];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = false;
    local_68._0_8_ = pmVar1;
    local_58.m_outbound_quantity = iVar2;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = true;
    iVar2 = (this->m_settings).m_store.m_ints._M_elems[0x9b];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = false;
    local_68._0_8_ = pmVar1;
    local_58.m_inbound_length = iVar2;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = true;
    iVar2 = (this->m_settings).m_store.m_ints._M_elems[0x9c];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
    local_58.m_outbound_length = iVar2;
    psVar3 = session_settings::get_str_abi_cxx11_(&this->m_settings,9);
    local_68[8] = false;
    local_68._0_8_ = pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = true;
    iVar2 = (this->m_settings).m_store.m_ints._M_elems[0x7d];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
    local_48._M_f = (offset_in_session_impl_to_subr)on_i2p_open;
    local_48._8_8_ = 0;
    local_48._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
         (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)this;
    i2p_connection::
    open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
              (&this->m_i2p_conn,psVar3,iVar2,&local_58,&local_48);
  }
  return;
}

Assistant:

void session_impl::update_i2p_bridge()
	{
		// we need this socket to be open before we
		// can make name lookups for trackers for instance.
		// pause the session now and resume it once we've
		// established the i2p SAM connection
#if TORRENT_USE_I2P
		if (m_settings.get_str(settings_pack::i2p_hostname).empty())
		{
			error_code ec;
			m_i2p_conn.close(ec);
			return;
		}
		TORRENT_ASSERT(!m_abort);
		i2p_session_options session_options{
			m_settings.get_int(settings_pack::i2p_inbound_quantity)
			, m_settings.get_int(settings_pack::i2p_outbound_quantity)
			, m_settings.get_int(settings_pack::i2p_inbound_length)
			, m_settings.get_int(settings_pack::i2p_outbound_length)
		};
		m_i2p_conn.open(m_settings.get_str(settings_pack::i2p_hostname)
			, m_settings.get_int(settings_pack::i2p_port)
			, session_options
			, std::bind(&session_impl::on_i2p_open, this, _1));
#endif
	}